

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

void UserInterface::pushMessage(string *s,bool isError)

{
  ostream *poVar1;
  Vector2u VVar2;
  _Node *p_Var3;
  Uint8 blue;
  Uint8 green;
  Uint8 red;
  _List_node_base *p_Var4;
  Color local_400;
  Color local_3fc;
  _Any_data local_3f8;
  code *local_3e8;
  undefined8 uStack_3e0;
  Color local_3d0;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (_messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl.
      _M_node._M_size < 4) {
    if (_messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl.
        _M_node.super__List_node_base._M_next != (_List_node_base *)&_messageList_abi_cxx11_)
    goto LAB_001415d9;
  }
  else {
    std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::pop_back(&_messageList_abi_cxx11_);
    for (p_Var4 = _messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        p_Var4 != (_List_node_base *)&_messageList_abi_cxx11_;
        p_Var4 = (((_List_base<TextButton,_std::allocator<TextButton>_> *)&p_Var4->_M_next)->_M_impl
                 )._M_node.super__List_node_base._M_next) {
      sf::Transformable::move((Transformable *)&p_Var4[1]._M_prev,0.0,30.0);
    }
  }
  sf::Clock::restart(&_messageClock);
LAB_001415d9:
  sf::Color::Color(&local_400);
  if (isError) {
    red = 0xff;
    green = '\x1f';
    blue = '\x1f';
  }
  else {
    red = '\x1f';
    green = '=';
    blue = 0xff;
  }
  sf::Color::Color(&local_3d0,red,green,blue,200);
  local_400 = local_3d0;
  sf::Color::Color(&local_3fc,'\0','\0','\0',200);
  VVar2 = Simulator::getWindowSize();
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e8 = (code *)0x0;
  uStack_3e0 = 0;
  TextButton::TextButton
            ((TextButton *)&local_3d0,s,&local_3fc,0x10,10.0,
             (float)((ulong)VVar2 >> 0x20) + -35.0 +
             (float)_messageList_abi_cxx11_.
                    super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl._M_node.
                    _M_size * -30.0,&local_400,(Color *)&sf::Color::Black,
             (function<void_(int)> *)&local_3f8,0);
  p_Var3 = std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::_M_create_node<TextButton>
                     (&_messageList_abi_cxx11_,(TextButton *)&local_3d0);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  _messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl._M_node.
  _M_size = _messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>.
            _M_impl._M_node._M_size + 1;
  TextButton::~TextButton((TextButton *)&local_3d0);
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  return;
}

Assistant:

void UserInterface::pushMessage(const string& s, bool isError) {
    cout << s << endl;
    if (_messageList.size() >= 4) {
        _messageList.pop_back();
        for (auto listIter = _messageList.begin(); listIter != _messageList.end(); ++listIter) {
            listIter->move(0.0f, 30.0f);
        }
        _messageClock.restart();
    } else if (_messageList.empty()) {
        _messageClock.restart();
    }
    
    Color messageColor;
    if (!isError) {
        messageColor = Color(31, 61, 255, 200);
    } else {
        messageColor = Color(255, 31, 31, 200);
    }
    _messageList.push_front(TextButton(s, Color(0, 0, 0, 200), 16, 10.0f, Simulator::getWindowSize().y - 35.0f - _messageList.size() * 30.0f, messageColor, Color::Black, nullptr));
}